

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

uchar * stbi__convert_format(uchar *data,int img_n,int req_comp,uint x,uint y)

{
  byte bVar1;
  undefined1 auVar2 [16];
  uchar *puVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  byte *pbVar9;
  long lVar10;
  uint uVar11;
  byte *pbVar12;
  ulong uVar13;
  ulong uVar14;
  long in_FS_OFFSET;
  undefined1 auVar15 [16];
  
  puVar3 = data;
  if (req_comp != img_n) {
    if (3 < req_comp - 1U) {
      pbrt::LogFatal<char_const(&)[31]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/ext/stb/stb_image.h"
                 ,0x6a4,"Check failed: %s",(char (*) [31])"req_comp >= 1 && req_comp <= 4");
    }
    puVar3 = (uchar *)stbi__malloc_mad3(req_comp,x,y,0);
    if (puVar3 == (uchar *)0x0) {
      free(data);
      *(char **)(in_FS_OFFSET + -0x268) = "outofmem";
      puVar3 = (uchar *)0x0;
    }
    else {
      if (0 < (int)y) {
        uVar11 = req_comp + img_n * 8;
        if ((0x23 < uVar11) || ((0xe161a1c00U >> ((ulong)uVar11 & 0x3f) & 1) == 0)) {
          pbrt::LogFatal<char_const(&)[2]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/ext/stb/stb_image.h"
                     ,0x6c1,"Check failed: %s",(char (*) [2])0x2c925ca);
        }
        iVar4 = x - 1;
        uVar6 = 1;
        if (1 < (int)y) {
          uVar6 = (ulong)y;
        }
        uVar13 = 0;
        auVar15[8] = 0xff;
        auVar15._0_8_ = 0xffffffffffffffff;
        auVar15[9] = 0xff;
        auVar15[10] = 0xff;
        auVar15[0xb] = 0xff;
        auVar15[0xc] = 0xff;
        auVar15[0xd] = 0xff;
        auVar15[0xe] = 0xff;
        auVar15[0xf] = 0xff;
        uVar14 = 0;
        uVar7 = 0;
        do {
          iVar8 = (int)uVar7 * x;
          pbVar12 = data + (uint)(iVar8 * img_n);
          pbVar9 = puVar3 + (uint)(iVar8 * req_comp);
          switch(uVar11) {
          case 10:
            if (-1 < iVar4) {
              lVar10 = 0;
              uVar5 = x;
              do {
                puVar3[lVar10 * 2 + uVar14] = data[lVar10 + uVar13];
                puVar3[lVar10 * 2 + uVar14 + 1] = 0xff;
                uVar5 = uVar5 - 1;
                lVar10 = lVar10 + 1;
              } while (0 < (int)uVar5);
            }
            break;
          case 0xb:
            if (-1 < iVar4) {
              pbVar9 = puVar3 + uVar14 + 2;
              uVar5 = x;
              do {
                bVar1 = *pbVar12;
                *pbVar9 = bVar1;
                pbVar9[-1] = bVar1;
                pbVar9[-2] = bVar1;
                pbVar12 = pbVar12 + 1;
                uVar5 = uVar5 - 1;
                pbVar9 = pbVar9 + 3;
              } while (0 < (int)uVar5);
            }
            break;
          case 0xc:
            if (-1 < iVar4) {
              lVar10 = 0;
              uVar5 = x;
              do {
                auVar2 = vpinsrb_avx(auVar15,(uint)data[lVar10 + uVar13],0);
                auVar2 = vpshufb_avx(auVar2,SUB6416(ZEXT464(0x1000000),0));
                *(int *)(puVar3 + lVar10 * 4 + uVar14) = auVar2._0_4_;
                uVar5 = uVar5 - 1;
                lVar10 = lVar10 + 1;
              } while (0 < (int)uVar5);
            }
            break;
          default:
            uVar5 = x;
            if (-1 < iVar4) {
              do {
                *pbVar9 = *pbVar12;
                pbVar9[1] = pbVar12[1];
                pbVar9[2] = pbVar12[2];
                pbVar12 = pbVar12 + 4;
                pbVar9 = pbVar9 + 3;
                uVar5 = uVar5 - 1;
              } while (0 < (int)uVar5);
            }
            break;
          case 0x11:
            if (-1 < iVar4) {
              lVar10 = 0;
              uVar5 = x;
              do {
                puVar3[lVar10 + uVar14] = data[lVar10 * 2 + uVar13];
                uVar5 = uVar5 - 1;
                lVar10 = lVar10 + 1;
              } while (0 < (int)uVar5);
            }
            break;
          case 0x13:
            if (-1 < iVar4) {
              pbVar9 = puVar3 + uVar14 + 2;
              uVar5 = x;
              do {
                bVar1 = *pbVar12;
                *pbVar9 = bVar1;
                pbVar9[-1] = bVar1;
                pbVar9[-2] = bVar1;
                pbVar12 = pbVar12 + 2;
                uVar5 = uVar5 - 1;
                pbVar9 = pbVar9 + 3;
              } while (0 < (int)uVar5);
            }
            break;
          case 0x14:
            if (-1 < iVar4) {
              lVar10 = 0;
              uVar5 = x;
              do {
                auVar2 = vpshufb_avx(ZEXT216(*(ushort *)(data + lVar10 + uVar13)),
                                     SUB6416(ZEXT464(0x1000000),0));
                *(int *)(puVar3 + lVar10 * 2 + uVar14) = auVar2._0_4_;
                uVar5 = uVar5 - 1;
                lVar10 = lVar10 + 2;
              } while (0 < (int)uVar5);
            }
            break;
          case 0x19:
            uVar5 = x;
            if (-1 < iVar4) {
              do {
                bVar1 = pbVar12[2];
                *pbVar9 = (byte)((uint)bVar1 * 2 + ((uint)bVar1 + (uint)bVar1 * 8) * 3 +
                                 (uint)pbVar12[1] * 0x96 + (uint)*pbVar12 * 0x4d >> 8);
                pbVar12 = pbVar12 + 3;
                pbVar9 = pbVar9 + 1;
                uVar5 = uVar5 - 1;
              } while (0 < (int)uVar5);
            }
            break;
          case 0x1a:
            uVar5 = x;
            if (-1 < iVar4) {
              do {
                bVar1 = pbVar12[2];
                *pbVar9 = (byte)((uint)bVar1 * 2 + ((uint)bVar1 + (uint)bVar1 * 8) * 3 +
                                 (uint)pbVar12[1] * 0x96 + (uint)*pbVar12 * 0x4d >> 8);
                pbVar9[1] = 0xff;
                pbVar12 = pbVar12 + 3;
                pbVar9 = pbVar9 + 2;
                uVar5 = uVar5 - 1;
              } while (0 < (int)uVar5);
            }
            break;
          case 0x1c:
            uVar5 = x;
            if (-1 < iVar4) {
              do {
                *pbVar9 = *pbVar12;
                pbVar9[1] = pbVar12[1];
                pbVar9[2] = pbVar12[2];
                pbVar9[3] = 0xff;
                pbVar12 = pbVar12 + 3;
                pbVar9 = pbVar9 + 4;
                uVar5 = uVar5 - 1;
              } while (0 < (int)uVar5);
            }
            break;
          case 0x21:
            if (-1 < iVar4) {
              lVar10 = 0;
              uVar5 = x;
              do {
                bVar1 = data[lVar10 * 4 + uVar13 + 2];
                puVar3[lVar10 + uVar14] =
                     (uchar)((uint)bVar1 * 2 + ((uint)bVar1 + (uint)bVar1 * 8) * 3 +
                             (uint)data[lVar10 * 4 + uVar13 + 1] * 0x96 +
                             (uint)data[lVar10 * 4 + uVar13] * 0x4d >> 8);
                uVar5 = uVar5 - 1;
                lVar10 = lVar10 + 1;
              } while (0 < (int)uVar5);
            }
            break;
          case 0x22:
            if (-1 < iVar4) {
              lVar10 = 0;
              uVar5 = x;
              do {
                bVar1 = data[lVar10 * 2 + uVar13 + 2];
                puVar3[lVar10 + uVar14] =
                     (uchar)((uint)bVar1 * 2 + ((uint)bVar1 + (uint)bVar1 * 8) * 3 +
                             (uint)data[lVar10 * 2 + uVar13 + 1] * 0x96 +
                             (uint)data[lVar10 * 2 + uVar13] * 0x4d >> 8);
                puVar3[lVar10 + uVar14 + 1] = data[lVar10 * 2 + uVar13 + 3];
                uVar5 = uVar5 - 1;
                lVar10 = lVar10 + 2;
              } while (0 < (int)uVar5);
            }
          }
          uVar7 = uVar7 + 1;
          uVar14 = (ulong)((int)uVar14 + x * req_comp);
          uVar13 = (ulong)((int)uVar13 + x * img_n);
        } while (uVar7 != uVar6);
      }
      free(data);
    }
  }
  return puVar3;
}

Assistant:

static unsigned char *stbi__convert_format(unsigned char *data, int img_n, int req_comp, unsigned int x, unsigned int y)
{
   int i,j;
   unsigned char *good;

   if (req_comp == img_n) return data;
   STBI_ASSERT(req_comp >= 1 && req_comp <= 4);

   good = (unsigned char *) stbi__malloc_mad3(req_comp, x, y, 0);
   if (good == NULL) {
      STBI_FREE(data);
      return stbi__errpuc("outofmem", "Out of memory");
   }

   for (j=0; j < (int) y; ++j) {
      unsigned char *src  = data + j * x * img_n   ;
      unsigned char *dest = good + j * x * req_comp;

      #define STBI__COMBO(a,b)  ((a)*8+(b))
      #define STBI__CASE(a,b)   case STBI__COMBO(a,b): for(i=x-1; i >= 0; --i, src += a, dest += b)
      // convert source image with img_n components to one with req_comp components;
      // avoid switch per pixel, so use switch per scanline and massive macros
      switch (STBI__COMBO(img_n, req_comp)) {
         STBI__CASE(1,2) { dest[0]=src[0]; dest[1]=255;                                     } break;
         STBI__CASE(1,3) { dest[0]=dest[1]=dest[2]=src[0];                                  } break;
         STBI__CASE(1,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=255;                     } break;
         STBI__CASE(2,1) { dest[0]=src[0];                                                  } break;
         STBI__CASE(2,3) { dest[0]=dest[1]=dest[2]=src[0];                                  } break;
         STBI__CASE(2,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=src[1];                  } break;
         STBI__CASE(3,4) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];dest[3]=255;        } break;
         STBI__CASE(3,1) { dest[0]=stbi__compute_y(src[0],src[1],src[2]);                   } break;
         STBI__CASE(3,2) { dest[0]=stbi__compute_y(src[0],src[1],src[2]); dest[1] = 255;    } break;
         STBI__CASE(4,1) { dest[0]=stbi__compute_y(src[0],src[1],src[2]);                   } break;
         STBI__CASE(4,2) { dest[0]=stbi__compute_y(src[0],src[1],src[2]); dest[1] = src[3]; } break;
         STBI__CASE(4,3) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];                    } break;
         default: STBI_ASSERT(0); STBI_FREE(data); STBI_FREE(good); return stbi__errpuc("unsupported", "Unsupported format conversion");
      }
      #undef STBI__CASE
   }

   STBI_FREE(data);
   return good;
}